

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
ApplyPredictFilter(VP8LEncoder *enc,int width,int height,int quality,int low_effort,
                  int used_subtract_green,VP8LBitWriter *bw)

{
  uint32_t sampling_bits;
  WebPEncodingError WVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long *in_RDI;
  int near_lossless_strength;
  int transform_height;
  int transform_width;
  int pred_bits;
  int in_stack_00000088;
  int in_stack_0000008c;
  VP8LBackwardRefs *in_stack_00000090;
  VP8LHashChain *in_stack_00000098;
  uint32_t *in_stack_000000a0;
  VP8LBitWriter *in_stack_000000a8;
  int in_stack_000000c0;
  int in_stack_000000c8;
  uint32_t *in_stack_00000ff0;
  uint32_t *in_stack_00000ff8;
  int in_stack_00001000;
  int in_stack_00001004;
  int in_stack_00001008;
  int in_stack_0000100c;
  uint32_t *in_stack_00001030;
  int in_stack_00001038;
  int in_stack_00001040;
  int in_stack_00001048;
  long lVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_38;
  
  sampling_bits = *(uint32_t *)(in_RDI + 9);
  VP8LSubSampleSize(in_ESI,sampling_bits);
  VP8LSubSampleSize(in_EDX,sampling_bits);
  if (*(int *)((long)in_RDI + 0x5c) == 0) {
    local_38 = *(undefined4 *)(*in_RDI + 0x5c);
  }
  else {
    local_38 = 100;
  }
  lVar2 = in_RDI[5];
  VP8LResidualImage(in_stack_0000100c,in_stack_00001008,in_stack_00001004,in_stack_00001000,
                    in_stack_00000ff8,in_stack_00000ff0,in_stack_00001030,in_stack_00001038,
                    in_stack_00001040,in_stack_00001048);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffffb4,local_38),
              (uint32_t)((ulong)lVar2 >> 0x20),(int)lVar2);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffffb4,local_38),
              (uint32_t)((ulong)lVar2 >> 0x20),(int)lVar2);
  VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffffb4,local_38),
              (uint32_t)((ulong)lVar2 >> 0x20),(int)lVar2);
  WVar1 = EncodeImageNoHuffman
                    (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                     in_stack_0000008c,in_stack_00000088,in_stack_000000c0,in_stack_000000c8);
  return WVar1;
}

Assistant:

static WebPEncodingError ApplyPredictFilter(const VP8LEncoder* const enc,
                                            int width, int height,
                                            int quality, int low_effort,
                                            int used_subtract_green,
                                            VP8LBitWriter* const bw) {
  const int pred_bits = enc->transform_bits_;
  const int transform_width = VP8LSubSampleSize(width, pred_bits);
  const int transform_height = VP8LSubSampleSize(height, pred_bits);
  // we disable near-lossless quantization if palette is used.
  const int near_lossless_strength = enc->use_palette_ ? 100
                                   : enc->config_->near_lossless;

  VP8LResidualImage(width, height, pred_bits, low_effort, enc->argb_,
                    enc->argb_scratch_, enc->transform_data_,
                    near_lossless_strength, enc->config_->exact,
                    used_subtract_green);
  VP8LPutBits(bw, TRANSFORM_PRESENT, 1);
  VP8LPutBits(bw, PREDICTOR_TRANSFORM, 2);
  assert(pred_bits >= 2);
  VP8LPutBits(bw, pred_bits - 2, 3);
  return EncodeImageNoHuffman(
      bw, enc->transform_data_, (VP8LHashChain*)&enc->hash_chain_,
      (VP8LBackwardRefs*)&enc->refs_[0], transform_width, transform_height,
      quality, low_effort);
}